

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O0

QIcon __thiscall
QCommonStylePrivate::iconFromResourceTheme
          (QCommonStylePrivate *this,StandardPixmap standardIcon,QStyleOption *option,
          QWidget *widget)

{
  QLatin1StringView latin1;
  initializer_list<int> sizes;
  initializer_list<int> sizes_00;
  initializer_list<int> sizes_01;
  initializer_list<int> sizes_02;
  initializer_list<int> sizes_03;
  initializer_list<int> sizes_04;
  initializer_list<int> sizes_05;
  initializer_list<int> sizes_06;
  initializer_list<int> sizes_07;
  initializer_list<int> sizes_08;
  initializer_list<int> sizes_09;
  initializer_list<int> sizes_10;
  initializer_list<int> sizes_11;
  initializer_list<int> sizes_12;
  initializer_list<int> sizes_13;
  initializer_list<int> sizes_14;
  initializer_list<int> sizes_15;
  initializer_list<int> sizes_16;
  initializer_list<int> sizes_17;
  initializer_list<int> sizes_18;
  initializer_list<int> sizes_19;
  initializer_list<int> sizes_20;
  initializer_list<int> sizes_21;
  initializer_list<int> sizes_22;
  initializer_list<int> sizes_23;
  initializer_list<int> sizes_24;
  initializer_list<int> sizes_25;
  initializer_list<int> sizes_26;
  initializer_list<int> sizes_27;
  initializer_list<int> sizes_28;
  initializer_list<int> sizes_29;
  initializer_list<int> sizes_30;
  initializer_list<int> sizes_31;
  initializer_list<int> sizes_32;
  initializer_list<int> sizes_33;
  initializer_list<int> sizes_34;
  initializer_list<int> sizes_35;
  initializer_list<int> sizes_36;
  initializer_list<int> sizes_37;
  initializer_list<int> sizes_38;
  initializer_list<int> sizes_39;
  initializer_list<int> sizes_40;
  initializer_list<int> sizes_41;
  initializer_list<int> sizes_42;
  initializer_list<int> sizes_43;
  initializer_list<int> sizes_44;
  initializer_list<int> sizes_45;
  initializer_list<int> sizes_46;
  initializer_list<int> sizes_47;
  initializer_list<int> sizes_48;
  initializer_list<int> sizes_49;
  initializer_list<int> sizes_50;
  initializer_list<int> sizes_51;
  initializer_list<int> sizes_52;
  initializer_list<int> sizes_53;
  initializer_list<int> sizes_54;
  initializer_list<int> sizes_55;
  initializer_list<int> sizes_56;
  initializer_list<int> sizes_57;
  initializer_list<int> sizes_58;
  initializer_list<int> sizes_59;
  initializer_list<int> sizes_60;
  initializer_list<int> sizes_61;
  initializer_list<int> sizes_62;
  initializer_list<int> sizes_63;
  QStringView prefix;
  QStringView prefix_00;
  QStringView prefix_01;
  QStringView prefix_02;
  QStringView prefix_03;
  QStringView prefix_04;
  QStringView prefix_05;
  QStringView prefix_06;
  QStringView prefix_07;
  QStringView prefix_08;
  QStringView prefix_09;
  QStringView prefix_10;
  QStringView prefix_11;
  QStringView prefix_12;
  QStringView prefix_13;
  QStringView prefix_14;
  QStringView prefix_15;
  QStringView prefix_16;
  QStringView prefix_17;
  QStringView prefix_18;
  QStringView prefix_19;
  QStringView prefix_20;
  QStringView prefix_21;
  QStringView prefix_22;
  QStringView prefix_23;
  QStringView prefix_24;
  QStringView prefix_25;
  QStringView prefix_26;
  QStringView prefix_27;
  QStringView prefix_28;
  QStringView prefix_29;
  QStringView prefix_30;
  QStringView prefix_31;
  QStringView prefix_32;
  QStringView prefix_33;
  QStringView prefix_34;
  QStringView prefix_35;
  QStringView prefix_36;
  QStringView prefix_37;
  QStringView prefix_38;
  QStringView prefix_39;
  QStringView prefix_40;
  QStringView prefix_41;
  QStringView prefix_42;
  QStringView prefix_43;
  QStringView prefix_44;
  QStringView prefix_45;
  QStringView prefix_46;
  QStringView prefix_47;
  QStringView prefix_48;
  QStringView prefix_49;
  QStringView prefix_50;
  QStringView prefix_51;
  QStringView prefix_52;
  QStringView prefix_53;
  QStringView prefix_54;
  QStringView prefix_55;
  QStringView prefix_56;
  QStringView prefix_57;
  QStringView prefix_58;
  QStringView prefix_59;
  QStringView prefix_60;
  QStringView prefix_61;
  QStringView prefix_62;
  QStringView prefix_63;
  bool bVar1;
  QStyle *pQVar2;
  QIcon *icon_00;
  char16_t *pcVar3;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 uVar4;
  QCommonStylePrivate *in_RSI;
  QIconPrivate *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  QCommonStyle *q;
  size_t RuntimeThreshold_49;
  size_t RuntimeThreshold_28;
  size_t RuntimeThreshold;
  size_t i;
  size_t i_28;
  size_t i_49;
  size_t RuntimeThreshold_46;
  size_t RuntimeThreshold_43;
  size_t RuntimeThreshold_35;
  size_t RuntimeThreshold_33;
  size_t RuntimeThreshold_32;
  size_t RuntimeThreshold_1;
  size_t i_1;
  size_t i_32;
  size_t i_33;
  size_t i_35;
  size_t i_43;
  size_t i_46;
  size_t RuntimeThreshold_45;
  size_t RuntimeThreshold_42;
  size_t RuntimeThreshold_29;
  size_t RuntimeThreshold_15;
  size_t RuntimeThreshold_13;
  size_t RuntimeThreshold_3;
  size_t RuntimeThreshold_2;
  size_t i_2;
  size_t i_3;
  size_t i_13;
  size_t i_15;
  size_t i_29;
  size_t i_42;
  size_t i_45;
  size_t RuntimeThreshold_9;
  size_t RuntimeThreshold_4;
  size_t i_4;
  size_t i_9;
  size_t RuntimeThreshold_8;
  size_t RuntimeThreshold_5;
  size_t i_5;
  size_t i_8;
  size_t RuntimeThreshold_55;
  size_t RuntimeThreshold_40;
  size_t RuntimeThreshold_14;
  size_t RuntimeThreshold_12;
  size_t RuntimeThreshold_11;
  size_t RuntimeThreshold_7;
  size_t RuntimeThreshold_6;
  size_t i_6;
  size_t i_7;
  size_t i_11;
  size_t i_12;
  size_t i_14;
  size_t i_40;
  size_t i_55;
  size_t RuntimeThreshold_23;
  size_t RuntimeThreshold_22;
  size_t RuntimeThreshold_21;
  size_t RuntimeThreshold_10;
  size_t i_10;
  size_t i_21;
  size_t i_22;
  size_t i_23;
  size_t RuntimeThreshold_26;
  size_t RuntimeThreshold_16;
  size_t i_16;
  size_t i_26;
  size_t RuntimeThreshold_24;
  size_t RuntimeThreshold_17;
  size_t i_17;
  size_t i_24;
  size_t RuntimeThreshold_54;
  size_t RuntimeThreshold_52;
  size_t RuntimeThreshold_20;
  size_t RuntimeThreshold_19;
  size_t RuntimeThreshold_18;
  size_t i_18;
  size_t i_19;
  size_t i_20;
  size_t i_52;
  size_t i_54;
  size_t RuntimeThreshold_56;
  size_t RuntimeThreshold_53;
  size_t RuntimeThreshold_51;
  size_t RuntimeThreshold_25;
  size_t i_25;
  size_t i_51;
  size_t i_53;
  size_t i_56;
  size_t RuntimeThreshold_50;
  size_t RuntimeThreshold_48;
  size_t RuntimeThreshold_30;
  size_t RuntimeThreshold_27;
  size_t i_27;
  size_t i_30;
  size_t i_48;
  size_t i_50;
  size_t RuntimeThreshold_63;
  size_t RuntimeThreshold_57;
  size_t RuntimeThreshold_38;
  size_t RuntimeThreshold_34;
  size_t RuntimeThreshold_31;
  size_t i_31;
  size_t i_34;
  size_t i_38;
  size_t i_57;
  size_t i_63;
  size_t RuntimeThreshold_39;
  size_t RuntimeThreshold_36;
  size_t i_36;
  size_t i_39;
  size_t RuntimeThreshold_37;
  size_t i_37;
  size_t RuntimeThreshold_47;
  size_t RuntimeThreshold_41;
  size_t i_41;
  size_t i_47;
  size_t RuntimeThreshold_44;
  size_t i_44;
  size_t RuntimeThreshold_58;
  size_t i_58;
  size_t RuntimeThreshold_59;
  size_t i_59;
  size_t RuntimeThreshold_60;
  size_t i_60;
  size_t RuntimeThreshold_61;
  size_t i_61;
  size_t RuntimeThreshold_62;
  size_t i_62;
  QIcon icon;
  undefined4 in_stack_ffffffffffffe4f8;
  undefined4 in_stack_ffffffffffffe4fc;
  QStyleOption *in_stack_ffffffffffffe500;
  char16_t *in_stack_ffffffffffffe508;
  QStringView *in_stack_ffffffffffffe510;
  QStringView *this_00;
  undefined8 in_stack_ffffffffffffe520;
  Mode MVar5;
  QIcon *in_stack_ffffffffffffe528;
  qsizetype in_stack_ffffffffffffe530;
  char *in_stack_ffffffffffffe538;
  iterator in_stack_ffffffffffffe5f0;
  iterator piVar6;
  size_type in_stack_ffffffffffffe5f8;
  qsizetype in_stack_ffffffffffffe600;
  undefined1 *puVar7;
  storage_type_conflict *in_stack_ffffffffffffe608;
  State in_stack_ffffffffffffe620;
  State state;
  ulong local_11f0;
  ulong local_11d8;
  ulong local_11c0;
  ulong local_1148;
  ulong local_1130;
  ulong local_1118;
  ulong local_1100;
  ulong local_10e8;
  ulong local_10d0;
  ulong local_1048;
  ulong local_1030;
  ulong local_1018;
  ulong local_1000;
  ulong local_fe8;
  ulong local_fd0;
  ulong local_fb8;
  ulong local_f80;
  ulong local_f68;
  ulong local_f30;
  ulong local_f18;
  ulong local_e90;
  ulong local_e78;
  ulong local_e60;
  ulong local_e48;
  ulong local_e30;
  ulong local_e18;
  ulong local_e00;
  ulong local_da8;
  ulong local_d90;
  ulong local_d78;
  ulong local_d60;
  ulong local_d28;
  ulong local_d10;
  ulong local_cd8;
  ulong local_cc0;
  ulong local_c58;
  ulong local_c40;
  ulong local_c28;
  ulong local_c10;
  ulong local_bf8;
  ulong local_ba0;
  ulong local_b88;
  ulong local_b70;
  ulong local_b58;
  ulong local_b00;
  ulong local_ae8;
  ulong local_ad0;
  ulong local_ab8;
  ulong local_a50;
  ulong local_a38;
  ulong local_a20;
  ulong local_a08;
  ulong local_9f0;
  ulong local_9b8;
  ulong local_9a0;
  ulong local_978;
  ulong local_940;
  ulong local_928;
  ulong local_900;
  ulong local_8d8;
  ulong local_8b0;
  ulong local_888;
  ulong local_860;
  ulong local_838;
  undefined1 local_810 [24];
  size_type local_7f8;
  QStringView local_7f0;
  undefined1 *local_7e0;
  QObject *local_7d8;
  undefined1 local_7d0 [16];
  undefined1 *local_7c0;
  size_type local_7b8;
  undefined1 *local_7a0;
  size_type local_798;
  undefined1 *local_780;
  size_type local_778;
  undefined1 *local_770;
  size_type local_768;
  undefined1 local_750 [8];
  undefined1 local_748 [24];
  QPixmap local_730 [24];
  undefined1 *local_718;
  size_type local_710;
  undefined1 *local_6d8;
  size_type local_6d0;
  undefined1 *local_6b8;
  size_type local_6b0;
  undefined1 *local_698;
  size_type local_690;
  undefined1 *local_678;
  size_type local_670;
  undefined1 *local_658;
  size_type local_650;
  undefined1 *local_638;
  size_type local_630;
  undefined1 *local_618;
  size_type local_610;
  int local_608 [4];
  undefined1 local_5f8 [32];
  undefined1 local_5d8 [16];
  undefined1 *local_5c8;
  size_type local_5c0;
  undefined1 *local_598;
  size_type local_590;
  undefined1 *local_578;
  size_type local_570;
  undefined1 *local_558;
  size_type local_550;
  undefined1 *local_538;
  size_type local_530;
  undefined1 *local_518;
  size_type local_510;
  undefined1 *local_4f8;
  size_type local_4f0;
  undefined1 *local_4d8;
  size_type local_4d0;
  undefined1 *local_4b8;
  size_type local_4b0;
  undefined1 *local_498;
  size_type local_490;
  undefined1 *local_478;
  size_type local_470;
  undefined1 *local_458;
  size_type local_450;
  undefined1 *local_438;
  size_type local_430;
  undefined1 *local_418;
  size_type local_410;
  undefined1 *local_3f8;
  size_type local_3f0;
  undefined1 *local_3d8;
  size_type local_3d0;
  undefined1 *local_3b8;
  size_type local_3b0;
  undefined1 *local_398;
  size_type local_390;
  undefined1 *local_378;
  size_type local_370;
  undefined1 *local_358;
  size_type local_350;
  undefined1 *local_338;
  size_type local_330;
  undefined1 *local_318;
  size_type local_310;
  undefined1 *local_2f8;
  size_type local_2f0;
  undefined1 *local_2d8;
  size_type local_2d0;
  undefined1 *local_2b8;
  size_type local_2b0;
  undefined1 *local_298;
  size_type local_290;
  undefined1 *local_278;
  size_type local_270;
  undefined1 *local_258;
  size_type local_250;
  undefined1 *local_238;
  size_type local_230;
  undefined1 *local_218;
  size_type local_210;
  undefined1 *local_1f8;
  size_type local_1f0;
  undefined1 *local_1d8;
  size_type local_1d0;
  undefined1 *local_1b8;
  size_type local_1b0;
  undefined1 *local_198;
  size_type local_190;
  undefined1 *local_178;
  size_type local_170;
  undefined1 *local_158;
  size_type local_150;
  undefined1 *local_138;
  size_type local_130;
  undefined1 *local_118;
  size_type local_110;
  undefined1 *local_f8;
  size_type local_f0;
  undefined1 *local_d8;
  size_type local_d0;
  undefined1 *local_b8;
  size_type local_b0;
  undefined1 *local_98;
  size_type local_90;
  undefined1 *local_78;
  size_type local_70;
  undefined1 *local_58;
  size_type local_50;
  QIcon local_38;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  MVar5 = (Mode)((ulong)in_stack_ffffffffffffe520 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RSI);
  local_38.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&local_38);
  switch(in_EDX) {
  case 0:
    titleBarMenuCachedPixmapFromXPM();
    QIcon::addPixmap((QPixmap *)&local_38,(Mode)local_730,On);
    QPixmap::~QPixmap(local_730);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_ffffffffffffe508,(size_t)in_stack_ffffffffffffe500);
    latin1.m_data = in_stack_ffffffffffffe538;
    latin1.m_size = in_stack_ffffffffffffe530;
    QString::QString((QString *)in_stack_ffffffffffffe510,latin1);
    QSize::QSize((QSize *)in_stack_ffffffffffffe500);
    QIcon::addFile((QString *)&local_38,(QSize *)local_748,(Mode)local_750,On);
    QString::~QString((QString *)0x3e96fe);
    break;
  case 1:
    std::data<char16_t_const,14ul>((char16_t (*) [14])0xb118e4);
    for (local_e90 = 0; (local_e90 < 0xe && (L"fusion_titlebar-min-"[local_e90 + 7] != L'\0'));
        local_e90 = local_e90 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_118 = _ZGRL13titleBarSizes_;
    local_110 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_05.m_data = in_stack_ffffffffffffe608;
    prefix_05.m_size = in_stack_ffffffffffffe600;
    sizes_05._M_len = in_stack_ffffffffffffe5f8;
    sizes_05._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_05,sizes_05,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 2:
    std::data<char16_t_const,14ul>((char16_t (*) [14])L"titlebar-max-");
    for (local_e78 = 0; (local_e78 < 0xe && (L"titlebar-max-"[local_e78] != L'\0'));
        local_e78 = local_e78 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_138 = _ZGRL13titleBarSizes_;
    local_130 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_06.m_data = in_stack_ffffffffffffe608;
    prefix_06.m_size = in_stack_ffffffffffffe600;
    sizes_06._M_len = in_stack_ffffffffffffe5f8;
    sizes_06._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_06,sizes_06,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 3:
  case 8:
    std::data<char16_t_const,11ul>((char16_t (*) [11])0xb1190e);
    for (local_a08 = 0; (local_a08 < 0xb && (L"fusion_closedock-"[local_a08 + 7] != L'\0'));
        local_a08 = local_a08 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_718 = _ZGRL18dockTitleIconSizes_;
    local_710 = 6;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_56.m_data = in_stack_ffffffffffffe608;
    prefix_56.m_size = in_stack_ffffffffffffe600;
    sizes_56._M_len = in_stack_ffffffffffffe5f8;
    sizes_56._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_56,sizes_56,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 4:
    std::data<char16_t_const,17ul>((char16_t (*) [17])0xb118b4);
    for (local_8d8 = 0; (local_8d8 < 0x11 && (L"fusion_normalizedockup-"[local_8d8 + 7] != L'\0'));
        local_8d8 = local_8d8 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_770 = _ZGRL18dockTitleIconSizes_;
    local_768 = 6;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_57.m_data = in_stack_ffffffffffffe608;
    prefix_57.m_size = in_stack_ffffffffffffe600;
    sizes_57._M_len = in_stack_ffffffffffffe5f8;
    sizes_57._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_57,sizes_57,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 5:
    std::data<char16_t_const,16ul>((char16_t (*) [16])L"titlebar-shade-");
    for (local_f18 = 0; (local_f18 < 0x10 && (L"titlebar-shade-"[local_f18] != L'\0'));
        local_f18 = local_f18 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_158 = _ZGRL13titleBarSizes_;
    local_150 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_07.m_data = in_stack_ffffffffffffe608;
    prefix_07.m_size = in_stack_ffffffffffffe600;
    sizes_07._M_len = in_stack_ffffffffffffe5f8;
    sizes_07._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_07,sizes_07,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 6:
    std::data<char16_t_const,18ul>((char16_t (*) [18])L"titlebar-unshade-");
    for (local_f68 = 0; (local_f68 < 0x12 && (L"titlebar-unshade-"[local_f68] != L'\0'));
        local_f68 = local_f68 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_178 = _ZGRL13titleBarSizes_;
    local_170 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_08.m_data = in_stack_ffffffffffffe608;
    prefix_08.m_size = in_stack_ffffffffffffe600;
    sizes_08._M_len = in_stack_ffffffffffffe5f8;
    sizes_08._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_08,sizes_08,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 7:
    std::data<char16_t_const,22ul>((char16_t (*) [22])L"titlebar-contexthelp-");
    for (local_da8 = 0; (local_da8 < 0x16 && (L"titlebar-contexthelp-"[local_da8] != L'\0'));
        local_da8 = local_da8 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_198 = _ZGRL13titleBarSizes_;
    local_190 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_09.m_data = in_stack_ffffffffffffe608;
    prefix_09.m_size = in_stack_ffffffffffffe600;
    sizes_09._M_len = in_stack_ffffffffffffe5f8;
    sizes_09._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_09,sizes_09,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 9:
    std::data<char16_t_const,13ul>((char16_t (*) [13])L"information-");
    for (local_11f0 = 0; (local_11f0 < 0xd && (L"information-"[local_11f0] != L'\0'));
        local_11f0 = local_11f0 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_58 = _ZGRL12pngIconSizes_;
    local_50 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix.m_data = in_stack_ffffffffffffe608;
    prefix.m_size = in_stack_ffffffffffffe600;
    sizes._M_len = in_stack_ffffffffffffe5f8;
    sizes._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix,sizes,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 10:
    std::data<char16_t_const,9ul>((char16_t (*) [9])L"warning-");
    for (local_1148 = 0; (local_1148 < 9 && (L"warning-"[local_1148] != L'\0'));
        local_1148 = local_1148 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_78 = _ZGRL12pngIconSizes_;
    local_70 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_00.m_data = in_stack_ffffffffffffe608;
    prefix_00.m_size = in_stack_ffffffffffffe600;
    sizes_00._M_len = in_stack_ffffffffffffe5f8;
    sizes_00._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_00,sizes_00,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0xb:
    std::data<char16_t_const,10ul>((char16_t (*) [10])L"critical-");
    for (local_1048 = 0; (local_1048 < 10 && (L"critical-"[local_1048] != L'\0'));
        local_1048 = local_1048 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_98 = _ZGRL12pngIconSizes_;
    local_90 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_01.m_data = in_stack_ffffffffffffe608;
    prefix_01.m_size = in_stack_ffffffffffffe600;
    sizes_01._M_len = in_stack_ffffffffffffe5f8;
    sizes_01._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_01,sizes_01,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0xc:
    std::data<char16_t_const,10ul>((char16_t (*) [10])L"question-");
    for (local_1030 = 0; (local_1030 < 10 && (L"question-"[local_1030] != L'\0'));
        local_1030 = local_1030 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_b8 = _ZGRL12pngIconSizes_;
    local_b0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_02.m_data = in_stack_ffffffffffffe608;
    prefix_02.m_size = in_stack_ffffffffffffe600;
    sizes_02._M_len = in_stack_ffffffffffffe5f8;
    sizes_02._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_02,sizes_02,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0xd:
    std::data<char16_t_const,9ul>((char16_t (*) [9])L"desktop-");
    for (local_10e8 = 0; (local_10e8 < 9 && (L"desktop-"[local_10e8] != L'\0'));
        local_10e8 = local_10e8 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_10 = 0x10;
    local_c = 0x20;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_42.m_data = in_stack_ffffffffffffe608;
    prefix_42.m_size = in_stack_ffffffffffffe600;
    sizes_42._M_len = in_stack_ffffffffffffe5f8;
    sizes_42._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_42,sizes_42,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0xe:
    std::data<char16_t_const,7ul>((char16_t (*) [7])L"trash-");
    for (local_900 = 0; (local_900 < 7 && (L"trash-"[local_900] != L'\0'));
        local_900 = local_900 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_5c8 = _ZGRL12pngIconSizes_;
    local_5c0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_43.m_data = in_stack_ffffffffffffe608;
    prefix_43.m_size = in_stack_ffffffffffffe600;
    sizes_43._M_len = in_stack_ffffffffffffe5f8;
    sizes_43._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_43,sizes_43,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0xf:
    state = (State)local_5d8;
    std::data<char16_t_const,10ul>((char16_t (*) [10])L"computer-");
    for (local_fb8 = 0; (local_fb8 < 10 && (L"computer-"[local_fb8] != L'\0'));
        local_fb8 = local_fb8 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_18 = 0x10;
    local_14 = 0x20;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_44.m_data = in_stack_ffffffffffffe608;
    prefix_44.m_size = in_stack_ffffffffffffe600;
    sizes_44._M_len = in_stack_ffffffffffffe5f8;
    sizes_44._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_44,sizes_44,in_stack_ffffffffffffe528,MVar5,state);
    break;
  case 0x10:
    std::data<char16_t_const,8ul>((char16_t (*) [8])L"floppy-");
    for (local_978 = 0; (local_978 < 8 && (L"floppy-"[local_978] != L'\0'));
        local_978 = local_978 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_4f8 = _ZGRL12pngIconSizes_;
    local_4f0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_36.m_data = in_stack_ffffffffffffe608;
    prefix_36.m_size = in_stack_ffffffffffffe600;
    sizes_36._M_len = in_stack_ffffffffffffe5f8;
    sizes_36._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_36,sizes_36,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x11:
    std::data<char16_t_const,11ul>((char16_t (*) [11])L"harddrive-");
    for (local_a20 = 0; (local_a20 < 0xb && (L"harddrive-"[local_a20] != L'\0'));
        local_a20 = local_a20 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_518 = _ZGRL12pngIconSizes_;
    local_510 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_37.m_data = in_stack_ffffffffffffe608;
    prefix_37.m_size = in_stack_ffffffffffffe600;
    sizes_37._M_len = in_stack_ffffffffffffe5f8;
    sizes_37._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_37,sizes_37,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x12:
    std::data<char16_t_const,5ul>((char16_t (*) [5])L"cdr-");
    for (local_9b8 = 0; (local_9b8 < 5 && (L"cdr-"[local_9b8] != L'\0')); local_9b8 = local_9b8 + 1)
    {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_4d8 = _ZGRL12pngIconSizes_;
    local_4d0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_35.m_data = in_stack_ffffffffffffe608;
    prefix_35.m_size = in_stack_ffffffffffffe600;
    sizes_35._M_len = in_stack_ffffffffffffe5f8;
    sizes_35._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_35,sizes_35,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x13:
    std::data<char16_t_const,5ul>((char16_t (*) [5])L"dvd-");
    for (local_9a0 = 0; (local_9a0 < 5 && (L"dvd-"[local_9a0] != L'\0')); local_9a0 = local_9a0 + 1)
    {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_538 = _ZGRL12pngIconSizes_;
    local_530 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_38.m_data = in_stack_ffffffffffffe608;
    prefix_38.m_size = in_stack_ffffffffffffe600;
    sizes_38._M_len = in_stack_ffffffffffffe5f8;
    sizes_38._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_38,sizes_38,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x14:
    std::data<char16_t_const,14ul>((char16_t (*) [14])L"networkdrive-");
    for (local_e18 = 0; (local_e18 < 0xe && (L"networkdrive-"[local_e18] != L'\0'));
        local_e18 = local_e18 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_558 = _ZGRL12pngIconSizes_;
    local_550 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_39.m_data = in_stack_ffffffffffffe608;
    prefix_39.m_size = in_stack_ffffffffffffe600;
    sizes_39._M_len = in_stack_ffffffffffffe5f8;
    sizes_39._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_39,sizes_39,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x15:
    std::data<char16_t_const,9ul>((char16_t (*) [9])L"diropen-");
    for (local_1118 = 0; (local_1118 < 9 && (L"diropen-"[local_1118] != L'\0'));
        local_1118 = local_1118 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_478 = _ZGRL12pngIconSizes_;
    local_470 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_32.m_data = in_stack_ffffffffffffe608;
    prefix_32.m_size = in_stack_ffffffffffffe600;
    sizes_32._M_len = in_stack_ffffffffffffe5f8;
    sizes_32._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_32,sizes_32,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x16:
    std::data<char16_t_const,11ul>((char16_t (*) [11])L"dirclosed-");
    for (local_a38 = 0; (local_a38 < 0xb && (L"dirclosed-"[local_a38] != L'\0'));
        local_a38 = local_a38 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_498 = _ZGRL12pngIconSizes_;
    local_490 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_33.m_data = in_stack_ffffffffffffe608;
    prefix_33.m_size = in_stack_ffffffffffffe600;
    sizes_33._M_len = in_stack_ffffffffffffe5f8;
    sizes_33._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_33,sizes_33,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x17:
    std::data<char16_t_const,9ul>((char16_t (*) [9])L"dirlink-");
    for (local_1100 = 0; (local_1100 < 9 && (L"dirlink-"[local_1100] != L'\0'));
        local_1100 = local_1100 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_4b8 = _ZGRL12pngIconSizes_;
    local_4b0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_34.m_data = in_stack_ffffffffffffe608;
    prefix_34.m_size = in_stack_ffffffffffffe600;
    sizes_34._M_len = in_stack_ffffffffffffe5f8;
    sizes_34._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_34,sizes_34,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  default:
    break;
  case 0x19:
    std::data<char16_t_const,6ul>((char16_t (*) [6])L"file-");
    for (local_940 = 0; (local_940 < 6 && (L"file-"[local_940] != L'\0')); local_940 = local_940 + 1
        ) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_578 = _ZGRL12pngIconSizes_;
    local_570 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_40.m_data = in_stack_ffffffffffffe608;
    prefix_40.m_size = in_stack_ffffffffffffe600;
    sizes_40._M_len = in_stack_ffffffffffffe5f8;
    sizes_40._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_40,sizes_40,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x1a:
    std::data<char16_t_const,10ul>((char16_t (*) [10])L"filelink-");
    for (local_fd0 = 0; (local_fd0 < 10 && (L"filelink-"[local_fd0] != L'\0'));
        local_fd0 = local_fd0 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_598 = _ZGRL12pngIconSizes_;
    local_590 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_41.m_data = in_stack_ffffffffffffe608;
    prefix_41.m_size = in_stack_ffffffffffffe600;
    sizes_41._M_len = in_stack_ffffffffffffe5f8;
    sizes_41._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_41,sizes_41,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x1b:
    bVar1 = rtl(in_stack_ffffffffffffe500);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____sv
                (in_stack_ffffffffffffe508,(size_t)in_stack_ffffffffffffe500);
    }
    else {
      Qt::Literals::StringLiterals::operator____sv
                (in_stack_ffffffffffffe508,(size_t)in_stack_ffffffffffffe500);
    }
    local_780 = _ZGRL16toolBarExtHSizes_;
    local_778 = 4;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_58.m_data = in_stack_ffffffffffffe608;
    prefix_58.m_size = in_stack_ffffffffffffe600;
    sizes_58._M_len = in_stack_ffffffffffffe5f8;
    sizes_58._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_58,sizes_58,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x1c:
    std::data<char16_t_const,15ul>((char16_t (*) [15])L"toolbar-ext-v-");
    for (local_8b0 = 0; (local_8b0 < 0xf && (L"toolbar-ext-v-"[local_8b0] != L'\0'));
        local_8b0 = local_8b0 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_7a0 = _ZGRL16toolBarExtVSizes_;
    local_798 = 4;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_59.m_data = in_stack_ffffffffffffe608;
    prefix_59.m_size = in_stack_ffffffffffffe600;
    sizes_59._M_len = in_stack_ffffffffffffe5f8;
    sizes_59._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_59,sizes_59,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x1d:
    std::data<char16_t_const,18ul>((char16_t (*) [18])L"filedialog_start-");
    for (local_f80 = 0; (local_f80 < 0x12 && (L"filedialog_start-"[local_f80] != L'\0'));
        local_f80 = local_f80 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_d8 = _ZGRL12pngIconSizes_;
    local_d0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_03.m_data = in_stack_ffffffffffffe608;
    prefix_03.m_size = in_stack_ffffffffffffe600;
    sizes_03._M_len = in_stack_ffffffffffffe5f8;
    sizes_03._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_03,sizes_03,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x1e:
    std::data<char16_t_const,16ul>((char16_t (*) [16])L"filedialog_end-");
    for (local_f30 = 0; (local_f30 < 0x10 && (L"filedialog_end-"[local_f30] != L'\0'));
        local_f30 = local_f30 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_f8 = _ZGRL12pngIconSizes_;
    local_f0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_04.m_data = in_stack_ffffffffffffe608;
    prefix_04.m_size = in_stack_ffffffffffffe600;
    sizes_04._M_len = in_stack_ffffffffffffe5f8;
    sizes_04._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_04,sizes_04,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x1f:
    pQVar2 = QStyle::proxy((QStyle *)in_stack_ffffffffffffe510);
    (**(code **)(*(long *)pQVar2 + 0x100))(in_RDI,pQVar2,0x32,in_RCX,in_R8);
    goto LAB_003e9f46;
  case 0x20:
    std::data<char16_t_const,14ul>((char16_t (*) [14])L"newdirectory-");
    for (local_e60 = 0; (local_e60 < 0xe && (L"newdirectory-"[local_e60] != L'\0'));
        local_e60 = local_e60 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_1b8 = _ZGRL12pngIconSizes_;
    local_1b0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_10.m_data = in_stack_ffffffffffffe608;
    prefix_10.m_size = in_stack_ffffffffffffe600;
    sizes_10._M_len = in_stack_ffffffffffffe5f8;
    sizes_10._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_10,sizes_10,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x21:
    std::data<char16_t_const,14ul>((char16_t (*) [14])L"viewdetailed-");
    for (local_e48 = 0; (local_e48 < 0xe && (L"viewdetailed-"[local_e48] != L'\0'));
        local_e48 = local_e48 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_1d8 = _ZGRL12pngIconSizes_;
    local_1d0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_11.m_data = in_stack_ffffffffffffe608;
    prefix_11.m_size = in_stack_ffffffffffffe600;
    sizes_11._M_len = in_stack_ffffffffffffe5f8;
    sizes_11._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_11,sizes_11,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x22:
    std::data<char16_t_const,10ul>((char16_t (*) [10])L"fileinfo-");
    for (local_1018 = 0; (local_1018 < 10 && (L"fileinfo-"[local_1018] != L'\0'));
        local_1018 = local_1018 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_1f8 = _ZGRL12pngIconSizes_;
    local_1f0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_12.m_data = in_stack_ffffffffffffe608;
    prefix_12.m_size = in_stack_ffffffffffffe600;
    sizes_12._M_len = in_stack_ffffffffffffe5f8;
    sizes_12._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_12,sizes_12,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x23:
    std::data<char16_t_const,14ul>((char16_t (*) [14])L"filecontents-");
    for (local_e30 = 0; (local_e30 < 0xe && (L"filecontents-"[local_e30] != L'\0'));
        local_e30 = local_e30 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_218 = _ZGRL12pngIconSizes_;
    local_210 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_13.m_data = in_stack_ffffffffffffe608;
    prefix_13.m_size = in_stack_ffffffffffffe600;
    sizes_13._M_len = in_stack_ffffffffffffe5f8;
    sizes_13._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_13,sizes_13,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x24:
    std::data<char16_t_const,10ul>((char16_t (*) [10])L"viewlist-");
    for (local_1000 = 0; (local_1000 < 10 && (L"viewlist-"[local_1000] != L'\0'));
        local_1000 = local_1000 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_238 = _ZGRL12pngIconSizes_;
    local_230 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_14.m_data = in_stack_ffffffffffffe608;
    prefix_14.m_size = in_stack_ffffffffffffe600;
    sizes_14._M_len = in_stack_ffffffffffffe5f8;
    sizes_14._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_14,sizes_14,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x25:
    pQVar2 = QStyle::proxy((QStyle *)in_stack_ffffffffffffe510);
    (**(code **)(*(long *)pQVar2 + 0x100))(in_RDI,pQVar2,0x36,in_RCX,in_R8);
    goto LAB_003e9f46;
  case 0x26:
  case 0x38:
    std::data<char16_t_const,11ul>((char16_t (*) [11])L"dirclosed-");
    for (local_a50 = 0; (local_a50 < 0xb && (L"dirclosed-"[local_a50] != L'\0'));
        local_a50 = local_a50 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_438 = _ZGRL12pngIconSizes_;
    local_430 = 3;
    prefix_30.m_data = in_stack_ffffffffffffe608;
    prefix_30.m_size = in_stack_ffffffffffffe600;
    sizes_30._M_len = in_stack_ffffffffffffe5f8;
    sizes_30._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_30,sizes_30,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    std::data<char16_t_const,9ul>((char16_t (*) [9])L"diropen-");
    for (local_1130 = 0; (local_1130 < 9 && (L"diropen-"[local_1130] != L'\0'));
        local_1130 = local_1130 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_458 = _ZGRL12pngIconSizes_;
    local_450 = 3;
    in_stack_ffffffffffffe4f8 = 0;
    prefix_31.m_data = in_stack_ffffffffffffe608;
    prefix_31.m_size = in_stack_ffffffffffffe600;
    sizes_31._M_len = in_stack_ffffffffffffe5f8;
    sizes_31._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_31,sizes_31,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x27:
    std::data<char16_t_const,19ul>((char16_t (*) [19])L"standardbutton-ok-");
    for (local_d28 = 0; (local_d28 < 0x13 && (L"standardbutton-ok-"[local_d28] != L'\0'));
        local_d28 = local_d28 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_258 = _ZGRL12pngIconSizes_;
    local_250 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_15.m_data = in_stack_ffffffffffffe608;
    prefix_15.m_size = in_stack_ffffffffffffe600;
    sizes_15._M_len = in_stack_ffffffffffffe5f8;
    sizes_15._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_15,sizes_15,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x28:
    std::data<char16_t_const,23ul>((char16_t (*) [23])L"standardbutton-cancel-");
    for (local_cd8 = 0; (local_cd8 < 0x17 && (L"standardbutton-cancel-"[local_cd8] != L'\0'));
        local_cd8 = local_cd8 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_278 = _ZGRL12pngIconSizes_;
    local_270 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_16.m_data = in_stack_ffffffffffffe608;
    prefix_16.m_size = in_stack_ffffffffffffe600;
    sizes_16._M_len = in_stack_ffffffffffffe5f8;
    sizes_16._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_16,sizes_16,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x29:
    std::data<char16_t_const,21ul>((char16_t (*) [21])L"standardbutton-help-");
    for (local_c58 = 0; (local_c58 < 0x15 && (L"standardbutton-help-"[local_c58] != L'\0'));
        local_c58 = local_c58 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_298 = _ZGRL12pngIconSizes_;
    local_290 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_17.m_data = in_stack_ffffffffffffe608;
    prefix_17.m_size = in_stack_ffffffffffffe600;
    sizes_17._M_len = in_stack_ffffffffffffe5f8;
    sizes_17._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_17,sizes_17,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x2a:
    std::data<char16_t_const,21ul>((char16_t (*) [21])L"standardbutton-open-");
    for (local_c40 = 0; (local_c40 < 0x15 && (L"standardbutton-open-"[local_c40] != L'\0'));
        local_c40 = local_c40 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_2b8 = _ZGRL12pngIconSizes_;
    local_2b0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_18.m_data = in_stack_ffffffffffffe608;
    prefix_18.m_size = in_stack_ffffffffffffe600;
    sizes_18._M_len = in_stack_ffffffffffffe5f8;
    sizes_18._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_18,sizes_18,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x2b:
    std::data<char16_t_const,21ul>((char16_t (*) [21])L"standardbutton-save-");
    for (local_c28 = 0; (local_c28 < 0x15 && (L"standardbutton-save-"[local_c28] != L'\0'));
        local_c28 = local_c28 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_2d8 = _ZGRL12pngIconSizes_;
    local_2d0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_19.m_data = in_stack_ffffffffffffe608;
    prefix_19.m_size = in_stack_ffffffffffffe600;
    sizes_19._M_len = in_stack_ffffffffffffe5f8;
    sizes_19._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_19,sizes_19,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x2c:
    std::data<char16_t_const,22ul>((char16_t (*) [22])L"standardbutton-close-");
    for (local_d90 = 0; (local_d90 < 0x16 && (L"standardbutton-close-"[local_d90] != L'\0'));
        local_d90 = local_d90 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_2f8 = _ZGRL12pngIconSizes_;
    local_2f0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_20.m_data = in_stack_ffffffffffffe608;
    prefix_20.m_size = in_stack_ffffffffffffe600;
    sizes_20._M_len = in_stack_ffffffffffffe5f8;
    sizes_20._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_20,sizes_20,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x2d:
    std::data<char16_t_const,22ul>((char16_t (*) [22])L"standardbutton-apply-");
    for (local_d78 = 0; (local_d78 < 0x16 && (L"standardbutton-apply-"[local_d78] != L'\0'));
        local_d78 = local_d78 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_318 = _ZGRL12pngIconSizes_;
    local_310 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_21.m_data = in_stack_ffffffffffffe608;
    prefix_21.m_size = in_stack_ffffffffffffe600;
    sizes_21._M_len = in_stack_ffffffffffffe5f8;
    sizes_21._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_21,sizes_21,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x2e:
    std::data<char16_t_const,22ul>((char16_t (*) [22])L"standardbutton-clear-");
    for (local_d60 = 0; (local_d60 < 0x16 && (L"standardbutton-clear-"[local_d60] != L'\0'));
        local_d60 = local_d60 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_338 = _ZGRL12pngIconSizes_;
    local_330 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_22.m_data = in_stack_ffffffffffffe608;
    prefix_22.m_size = in_stack_ffffffffffffe600;
    sizes_22._M_len = in_stack_ffffffffffffe5f8;
    sizes_22._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_22,sizes_22,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x2f:
    std::data<char16_t_const,23ul>((char16_t (*) [23])L"standardbutton-delete-");
    for (local_cc0 = 0; (local_cc0 < 0x17 && (L"standardbutton-delete-"[local_cc0] != L'\0'));
        local_cc0 = local_cc0 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_358 = _ZGRL12pngIconSizes_;
    local_350 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_23.m_data = in_stack_ffffffffffffe608;
    prefix_23.m_size = in_stack_ffffffffffffe600;
    sizes_23._M_len = in_stack_ffffffffffffe5f8;
    sizes_23._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_23,sizes_23,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x30:
    std::data<char16_t_const,20ul>((char16_t (*) [20])L"standardbutton-yes-");
    for (local_ba0 = 0; (local_ba0 < 0x14 && (L"standardbutton-yes-"[local_ba0] != L'\0'));
        local_ba0 = local_ba0 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_378 = _ZGRL12pngIconSizes_;
    local_370 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_24.m_data = in_stack_ffffffffffffe608;
    prefix_24.m_size = in_stack_ffffffffffffe600;
    sizes_24._M_len = in_stack_ffffffffffffe5f8;
    sizes_24._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_24,sizes_24,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x31:
    std::data<char16_t_const,19ul>((char16_t (*) [19])L"standardbutton-no-");
    for (local_d10 = 0; (local_d10 < 0x13 && (L"standardbutton-no-"[local_d10] != L'\0'));
        local_d10 = local_d10 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_398 = _ZGRL12pngIconSizes_;
    local_390 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_25.m_data = in_stack_ffffffffffffe608;
    prefix_25.m_size = in_stack_ffffffffffffe600;
    sizes_25._M_len = in_stack_ffffffffffffe5f8;
    sizes_25._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_25,sizes_25,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x32:
    std::data<char16_t_const,10ul>((char16_t (*) [10])L"arrow-up-");
    for (local_fe8 = 0; (local_fe8 < 10 && (L"arrow-up-"[local_fe8] != L'\0'));
        local_fe8 = local_fe8 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_3f8 = _ZGRL12pngIconSizes_;
    local_3f0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_28.m_data = in_stack_ffffffffffffe608;
    prefix_28.m_size = in_stack_ffffffffffffe600;
    sizes_28._M_len = in_stack_ffffffffffffe5f8;
    sizes_28._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_28,sizes_28,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x33:
    std::data<char16_t_const,12ul>((char16_t (*) [12])L"arrow-down-");
    for (local_ae8 = 0; (local_ae8 < 0xc && (L"arrow-down-"[local_ae8] != L'\0'));
        local_ae8 = local_ae8 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_418 = _ZGRL12pngIconSizes_;
    local_410 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_29.m_data = in_stack_ffffffffffffe608;
    prefix_29.m_size = in_stack_ffffffffffffe600;
    sizes_29._M_len = in_stack_ffffffffffffe5f8;
    sizes_29._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_29,sizes_29,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x34:
    std::data<char16_t_const,12ul>((char16_t (*) [12])L"arrow-left-");
    for (local_b00 = 0; (local_b00 < 0xc && (L"arrow-left-"[local_b00] != L'\0'));
        local_b00 = local_b00 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_3b8 = _ZGRL12pngIconSizes_;
    local_3b0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_26.m_data = in_stack_ffffffffffffe608;
    prefix_26.m_size = in_stack_ffffffffffffe600;
    sizes_26._M_len = in_stack_ffffffffffffe5f8;
    sizes_26._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_26,sizes_26,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x35:
    std::data<char16_t_const,13ul>((char16_t (*) [13])L"arrow-right-");
    for (local_11d8 = 0; (local_11d8 < 0xd && (L"arrow-right-"[local_11d8] != L'\0'));
        local_11d8 = local_11d8 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_3d8 = _ZGRL12pngIconSizes_;
    local_3d0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_27.m_data = in_stack_ffffffffffffe608;
    prefix_27.m_size = in_stack_ffffffffffffe600;
    sizes_27._M_len = in_stack_ffffffffffffe5f8;
    sizes_27._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_27,sizes_27,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x36:
    pQVar2 = QStyle::proxy((QStyle *)in_stack_ffffffffffffe510);
    bVar1 = rtl(in_stack_ffffffffffffe500);
    uVar4 = 0x34;
    if (bVar1) {
      uVar4 = 0x35;
    }
    (**(code **)(*(long *)pQVar2 + 0x100))(in_RDI,pQVar2,uVar4,in_RCX,in_R8);
    goto LAB_003e9f46;
  case 0x37:
  case 0x39:
    pQVar2 = QStyle::proxy((QStyle *)in_stack_ffffffffffffe510);
    bVar1 = rtl(in_stack_ffffffffffffe500);
    uVar4 = 0x35;
    if (bVar1) {
      uVar4 = 0x34;
    }
    (**(code **)(*(long *)pQVar2 + 0x100))(in_RDI,pQVar2,uVar4,in_RCX,in_R8);
    goto LAB_003e9f46;
  case 0x3b:
    std::data<char16_t_const,9ul>((char16_t (*) [9])L"refresh-");
    for (local_10d0 = 0; (local_10d0 < 9 && (L"refresh-"[local_10d0] != L'\0'));
        local_10d0 = local_10d0 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_20 = 0x18;
    local_1c = 0x20;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_45.m_data = in_stack_ffffffffffffe608;
    prefix_45.m_size = in_stack_ffffffffffffe600;
    sizes_45._M_len = in_stack_ffffffffffffe5f8;
    sizes_45._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_45,sizes_45,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x3c:
    puVar7 = local_5f8;
    pcVar3 = std::data<char16_t_const,6ul>((char16_t (*) [6])0xaa8196);
    for (local_928 = 0; (local_928 < 6 && (L"media-stop-"[local_928 + 6] != L'\0'));
        local_928 = local_928 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_28 = 0x18;
    local_24 = 0x20;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_46.m_data = pcVar3;
    prefix_46.m_size = (qsizetype)puVar7;
    sizes_46._M_len = in_stack_ffffffffffffe5f8;
    sizes_46._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_46,sizes_46,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x3d:
    piVar6 = local_608;
    pcVar3 = std::data<char16_t_const,12ul>((char16_t (*) [12])L"media-play-");
    for (local_ad0 = 0; (local_ad0 < 0xc && (L"media-play-"[local_ad0] != L'\0'));
        local_ad0 = local_ad0 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_618 = _ZGRL12pngIconSizes_;
    local_610 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_47.m_data = in_stack_ffffffffffffe608;
    prefix_47.m_size = in_stack_ffffffffffffe600;
    sizes_47._M_len = (size_type)pcVar3;
    sizes_47._M_array = piVar6;
    addIconFiles<int>(prefix_47,sizes_47,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x3e:
    std::data<char16_t_const,12ul>((char16_t (*) [12])L"media-stop-");
    for (local_ab8 = 0; (local_ab8 < 0xc && (L"media-stop-"[local_ab8] != L'\0'));
        local_ab8 = local_ab8 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_658 = _ZGRL12pngIconSizes_;
    local_650 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_49.m_data = in_stack_ffffffffffffe608;
    prefix_49.m_size = in_stack_ffffffffffffe600;
    sizes_49._M_len = in_stack_ffffffffffffe5f8;
    sizes_49._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_49,sizes_49,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x3f:
    std::data<char16_t_const,13ul>((char16_t (*) [13])L"media-pause-");
    for (local_11c0 = 0; (local_11c0 < 0xd && (L"media-pause-"[local_11c0] != L'\0'));
        local_11c0 = local_11c0 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_638 = _ZGRL12pngIconSizes_;
    local_630 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_48.m_data = in_stack_ffffffffffffe608;
    prefix_48.m_size = in_stack_ffffffffffffe600;
    sizes_48._M_len = in_stack_ffffffffffffe5f8;
    sizes_48._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_48,sizes_48,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x40:
    std::data<char16_t_const,20ul>((char16_t (*) [20])L"media-skip-forward-");
    for (local_b70 = 0; (local_b70 < 0x14 && (L"media-skip-forward-"[local_b70] != L'\0'));
        local_b70 = local_b70 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_6b8 = _ZGRL12pngIconSizes_;
    local_6b0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_52.m_data = in_stack_ffffffffffffe608;
    prefix_52.m_size = in_stack_ffffffffffffe600;
    sizes_52._M_len = in_stack_ffffffffffffe5f8;
    sizes_52._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_52,sizes_52,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x41:
    std::data<char16_t_const,21ul>((char16_t (*) [21])L"media-skip-backward-");
    for (local_bf8 = 0; (local_bf8 < 0x15 && (L"media-skip-backward-"[local_bf8] != L'\0'));
        local_bf8 = local_bf8 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_6d8 = _ZGRL12pngIconSizes_;
    local_6d0 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_53.m_data = in_stack_ffffffffffffe608;
    prefix_53.m_size = in_stack_ffffffffffffe600;
    sizes_53._M_len = in_stack_ffffffffffffe5f8;
    sizes_53._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_53,sizes_53,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x42:
    std::data<char16_t_const,20ul>((char16_t (*) [20])L"media-seek-forward-");
    for (local_b88 = 0; (local_b88 < 0x14 && (L"media-seek-forward-"[local_b88] != L'\0'));
        local_b88 = local_b88 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_678 = _ZGRL12pngIconSizes_;
    local_670 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_50.m_data = in_stack_ffffffffffffe608;
    prefix_50.m_size = in_stack_ffffffffffffe600;
    sizes_50._M_len = in_stack_ffffffffffffe5f8;
    sizes_50._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_50,sizes_50,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x43:
    std::data<char16_t_const,21ul>((char16_t (*) [21])L"media-seek-backward-");
    for (local_c10 = 0; (local_c10 < 0x15 && (L"media-seek-backward-"[local_c10] != L'\0'));
        local_c10 = local_c10 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_698 = _ZGRL12pngIconSizes_;
    local_690 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_51.m_data = in_stack_ffffffffffffe608;
    prefix_51.m_size = in_stack_ffffffffffffe600;
    sizes_51._M_len = in_stack_ffffffffffffe5f8;
    sizes_51._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_51,sizes_51,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x44:
    std::data<char16_t_const,14ul>((char16_t (*) [14])L"media-volume-");
    for (local_e00 = 0; (local_e00 < 0xe && (L"media-volume-"[local_e00] != L'\0'));
        local_e00 = local_e00 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_2c = 0x10;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_54.m_data = in_stack_ffffffffffffe608;
    prefix_54.m_size = in_stack_ffffffffffffe600;
    sizes_54._M_len = in_stack_ffffffffffffe5f8;
    sizes_54._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_54,sizes_54,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x45:
    std::data<char16_t_const,20ul>((char16_t (*) [20])L"media-volume-muted-");
    for (local_b58 = 0; (local_b58 < 0x14 && (L"media-volume-muted-"[local_b58] != L'\0'));
        local_b58 = local_b58 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_30 = 0x10;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_55.m_data = in_stack_ffffffffffffe608;
    prefix_55.m_size = in_stack_ffffffffffffe600;
    sizes_55._M_len = in_stack_ffffffffffffe5f8;
    sizes_55._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_55,sizes_55,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x46:
    in_stack_ffffffffffffe500 = (QStyleOption *)local_810;
    pcVar3 = std::data<char16_t_const,11ul>((char16_t (*) [11])L"cleartext-");
    for (local_9f0 = 0; (local_9f0 < 0xb && (L"cleartext-"[local_9f0] != L'\0'));
        local_9f0 = local_9f0 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,pcVar3,(qsizetype)in_stack_ffffffffffffe500);
    in_stack_ffffffffffffe4f8 = 1;
    prefix_63.m_data = in_stack_ffffffffffffe608;
    prefix_63.m_size = in_stack_ffffffffffffe600;
    sizes_63._M_len = in_stack_ffffffffffffe5f8;
    sizes_63._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_63,sizes_63,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    break;
  case 0x4e:
    std::data<char16_t_const,25ul>((char16_t (*) [25])L"standardbutton-closetab-");
    for (local_888 = 0; (local_888 < 0x19 && (L"standardbutton-closetab-"[local_888] != L'\0'));
        local_888 = local_888 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_7c0 = _ZGRL12pngIconSizes_;
    local_7b8 = 3;
    prefix_60.m_data = in_stack_ffffffffffffe608;
    prefix_60.m_size = in_stack_ffffffffffffe600;
    sizes_60._M_len = in_stack_ffffffffffffe5f8;
    sizes_60._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_60,sizes_60,in_stack_ffffffffffffe528,MVar5,in_stack_ffffffffffffe620);
    MVar5 = (Mode)((ulong)local_7d0 >> 0x20);
    icon_00 = (QIcon *)std::data<char16_t_const,30ul>
                                 ((char16_t (*) [30])L"standardbutton-closetab-down-");
    for (local_860 = 0; (local_860 < 0x1e && (L"standardbutton-closetab-down-"[local_860] != L'\0'))
        ; local_860 = local_860 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
               (qsizetype)in_stack_ffffffffffffe500);
    local_7e0 = _ZGRL12pngIconSizes_;
    local_7d8 = (QObject *)3;
    prefix_61.m_data = in_stack_ffffffffffffe608;
    prefix_61.m_size = in_stack_ffffffffffffe600;
    sizes_61._M_len = in_stack_ffffffffffffe5f8;
    sizes_61._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_61,sizes_61,icon_00,MVar5,in_stack_ffffffffffffe620);
    this_00 = &local_7f0;
    std::data<char16_t_const,31ul>((char16_t (*) [31])L"standardbutton-closetab-hover-");
    for (local_838 = 0;
        (local_838 < 0x1f && (L"standardbutton-closetab-hover-"[local_838] != L'\0'));
        local_838 = local_838 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (this_00,in_stack_ffffffffffffe508,(qsizetype)in_stack_ffffffffffffe500);
    local_810._16_8_ = _ZGRL12pngIconSizes_;
    local_7f8 = 3;
    in_stack_ffffffffffffe4f8 = 1;
    prefix_62.m_data = in_stack_ffffffffffffe608;
    prefix_62.m_size = in_stack_ffffffffffffe600;
    sizes_62._M_len = in_stack_ffffffffffffe5f8;
    sizes_62._M_array = in_stack_ffffffffffffe5f0;
    addIconFiles<int>(prefix_62,sizes_62,icon_00,MVar5,in_stack_ffffffffffffe620);
  }
  QIcon::QIcon((QIcon *)in_stack_ffffffffffffe500,
               (QIcon *)CONCAT44(in_stack_ffffffffffffe4fc,in_stack_ffffffffffffe4f8));
LAB_003e9f46:
  QIcon::~QIcon(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QIcon)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QCommonStylePrivate::iconFromResourceTheme(QCommonStyle::StandardPixmap standardIcon,
                                                 const QStyleOption *option,
                                                 const QWidget *widget) const
{
    Q_Q(const QCommonStyle);
    QIcon icon;
#ifndef QT_NO_IMAGEFORMAT_PNG
    switch (standardIcon) {
    case QStyle::SP_MessageBoxInformation:
        addIconFiles(u"information-", pngIconSizes, icon);
        break;
    case QStyle::SP_MessageBoxWarning:
        addIconFiles(u"warning-", pngIconSizes, icon);
        break;
    case QStyle::SP_MessageBoxCritical:
        addIconFiles(u"critical-", pngIconSizes, icon);
        break;
    case QStyle::SP_MessageBoxQuestion:
        addIconFiles(u"question-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogStart:
        addIconFiles(u"filedialog_start-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogEnd:
        addIconFiles(u"filedialog_end-", pngIconSizes, icon);
        break;
    case QStyle::SP_TitleBarMinButton:
        addIconFiles(u"titlebar-min-", titleBarSizes, icon);
        break;
    case QStyle::SP_TitleBarMaxButton:
        addIconFiles(u"titlebar-max-", titleBarSizes, icon);
        break;
    case QStyle::SP_TitleBarShadeButton:
        addIconFiles(u"titlebar-shade-", titleBarSizes, icon);
        break;
    case QStyle::SP_TitleBarUnshadeButton:
        addIconFiles(u"titlebar-unshade-", titleBarSizes, icon);
        break;
    case QStyle::SP_TitleBarContextHelpButton:
        addIconFiles(u"titlebar-contexthelp-", titleBarSizes, icon);
        break;
     case QStyle::SP_FileDialogNewFolder:
        addIconFiles(u"newdirectory-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogBack:
        return q->proxy()->standardIcon(QStyle::SP_ArrowBack, option, widget);
    case QStyle::SP_FileDialogToParent:
        return q->proxy()->standardIcon(QStyle::SP_ArrowUp, option, widget);
    case QStyle::SP_FileDialogDetailedView:
        addIconFiles(u"viewdetailed-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogInfoView:
        addIconFiles(u"fileinfo-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogContentsView:
        addIconFiles(u"filecontents-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogListView:
        addIconFiles(u"viewlist-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogOkButton:
        addIconFiles(u"standardbutton-ok-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogCancelButton:
        addIconFiles(u"standardbutton-cancel-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogHelpButton:
        addIconFiles(u"standardbutton-help-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogOpenButton:
        addIconFiles(u"standardbutton-open-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogSaveButton:
        addIconFiles(u"standardbutton-save-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogCloseButton:
        addIconFiles(u"standardbutton-close-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogApplyButton:
        addIconFiles(u"standardbutton-apply-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogResetButton:
        addIconFiles(u"standardbutton-clear-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogDiscardButton:
        addIconFiles(u"standardbutton-delete-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogYesButton:
        addIconFiles(u"standardbutton-yes-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogNoButton:
        addIconFiles(u"standardbutton-no-", pngIconSizes, icon);
        break;
    case QStyle::SP_CommandLink:
    case QStyle::SP_ArrowForward:
        return q->proxy()->standardIcon(rtl(option) ? QStyle::SP_ArrowLeft
                                                    : QStyle::SP_ArrowRight,
                                        option, widget);
    case QStyle::SP_ArrowBack:
        return q->proxy()->standardIcon(rtl(option) ? QStyle::SP_ArrowRight
                                                    : QStyle::SP_ArrowLeft,
                                        option, widget);
    case QStyle::SP_ArrowLeft:
        addIconFiles(u"arrow-left-", pngIconSizes, icon);
        break;
    case QStyle::SP_ArrowRight:
        addIconFiles(u"arrow-right-", pngIconSizes, icon);
        break;
    case QStyle::SP_ArrowUp:
        addIconFiles(u"arrow-up-", pngIconSizes, icon);
        break;
    case QStyle::SP_ArrowDown:
        addIconFiles(u"arrow-down-", pngIconSizes, icon);
        break;
   case QStyle::SP_DirHomeIcon:
   case QStyle::SP_DirIcon:
        addIconFiles(u"dirclosed-", pngIconSizes, icon, QIcon::Normal, QIcon::Off);
        addIconFiles(u"diropen-", pngIconSizes, icon, QIcon::Normal, QIcon::On);
        break;
    case QStyle::SP_DirOpenIcon:
        addIconFiles(u"diropen-", pngIconSizes, icon);
        break;
    case QStyle::SP_DirClosedIcon:
        addIconFiles(u"dirclosed-", pngIconSizes, icon);
        break;
    case QStyle::SP_DirLinkIcon:
        addIconFiles(u"dirlink-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveCDIcon:
        addIconFiles(u"cdr-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveFDIcon:
        addIconFiles(u"floppy-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveHDIcon:
        addIconFiles(u"harddrive-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveDVDIcon:
        addIconFiles(u"dvd-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveNetIcon:
        addIconFiles(u"networkdrive-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileIcon:
        addIconFiles(u"file-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileLinkIcon:
        addIconFiles(u"filelink-", pngIconSizes, icon);
        break;
    case QStyle::SP_DesktopIcon:
        addIconFiles(u"desktop-", {16, 32}, icon);
        break;
    case QStyle::SP_TrashIcon:
        addIconFiles(u"trash-", pngIconSizes, icon);
        break;
    case QStyle::SP_ComputerIcon:
        addIconFiles(u"computer-", {16, 32}, icon);
        break;
    case QStyle::SP_BrowserReload:
        addIconFiles(u"refresh-", {24, 32}, icon);
        break;
    case QStyle::SP_BrowserStop:
        addIconFiles(u"stop-", {24, 32}, icon);
        break;
    case QStyle::SP_MediaPlay:
        addIconFiles(u"media-play-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaPause:
        addIconFiles(u"media-pause-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaStop:
        addIconFiles(u"media-stop-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaSeekForward:
        addIconFiles(u"media-seek-forward-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaSeekBackward:
        addIconFiles(u"media-seek-backward-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaSkipForward:
        addIconFiles(u"media-skip-forward-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaSkipBackward:
        addIconFiles(u"media-skip-backward-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaVolume:
        addIconFiles(u"media-volume-", {16}, icon);
        break;
    case QStyle::SP_MediaVolumeMuted:
        addIconFiles(u"media-volume-muted-", {16}, icon);
        break;
    case QStyle::SP_TitleBarCloseButton:
    case QStyle::SP_DockWidgetCloseButton:
        addIconFiles(u"closedock-", dockTitleIconSizes, icon);
        break;
    case QStyle::SP_TitleBarMenuButton:
#  ifndef QT_NO_IMAGEFORMAT_XPM
        icon.addPixmap(titleBarMenuCachedPixmapFromXPM());
#  endif
        icon.addFile(":/qt-project.org/qmessagebox/images/qtlogo-64.png"_L1);
        break;
    case QStyle::SP_TitleBarNormalButton:
        addIconFiles(u"normalizedockup-", dockTitleIconSizes, icon);
        break;
    case QStyle::SP_ToolBarHorizontalExtensionButton:
        addIconFiles(rtl(option) ? u"toolbar-ext-h-rtl-"_sv : u"toolbar-ext-h-"_sv, toolBarExtHSizes, icon);
        break;
    case QStyle::SP_ToolBarVerticalExtensionButton:
        addIconFiles(u"toolbar-ext-v-", toolBarExtVSizes, icon);
        break;
    case QStyle::SP_TabCloseButton:
        addIconFiles(u"standardbutton-closetab-", pngIconSizes, icon, QIcon::Normal, QIcon::Off);
        addIconFiles(u"standardbutton-closetab-down-", pngIconSizes, icon, QIcon::Normal, QIcon::On);
        addIconFiles(u"standardbutton-closetab-hover-", pngIconSizes, icon, QIcon::Active, QIcon::Off);
        break;
    case QStyle::SP_LineEditClearButton:
        addIconFiles(u"cleartext-", pngIconSizes, icon);
        break;
    default:
        break;
    }
#else // QT_NO_IMAGEFORMAT_PNG
    Q_UNUSED(standardIcon);
    Q_UNUSED(option);
    Q_UNUSED(widget);
#endif // QT_NO_IMAGEFORMAT_PNG
    return icon;
}